

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

void failure_rate_binary_fuse16(void)

{
  _Bool _Var1;
  int iVar2;
  uint uVar3;
  uint64_t *keys;
  size_t trial;
  long lVar4;
  size_t i;
  long lVar5;
  long lVar6;
  binary_fuse16_t bStack_58;
  
  puts("testing binary fuse16 for failure rate");
  keys = (uint64_t *)malloc(40000);
  bStack_58.Size = 5000;
  bStack_58.SegmentLength = 0x200;
  bStack_58.SegmentLengthMask = 0x1ff;
  bStack_58.SegmentCount = 0xb;
  bStack_58.SegmentCountLength = 0x1600;
  bStack_58.ArrayLength = 0x1a00;
  bStack_58.Fingerprints = (uint16_t *)calloc(0x1a00,2);
  lVar4 = 0;
  lVar6 = 0;
  do {
    lVar5 = 0;
    do {
      iVar2 = rand();
      uVar3 = rand();
      keys[lVar5] = ((ulong)uVar3 << 0x20) + (long)iVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5000);
    _Var1 = binary_fuse16_populate(keys,5000,&bStack_58);
    lVar6 = lVar6 + (ulong)!_Var1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x3e9);
  printf("failures %zu out of %zu\n\n",lVar6,1000000);
  free(bStack_58.Fingerprints);
  free(keys);
  return;
}

Assistant:

void failure_rate_binary_fuse16() {
  printf("testing binary fuse16 for failure rate\n");
  // we construct many 5000-long input cases and check the probability of failure.
  size_t size = 5000;
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  binary_fuse16_t filter;
  binary_fuse16_allocate((uint32_t)size, &filter);
  size_t failure = 0;
  size_t total_trials = 1000000;

  for(size_t trial = 0; trial <= 1000; trial++) {
    for (size_t i = 0; i < size; i++) {
      big_set[i] = (uint64_t)rand() + (((uint64_t) rand()) << 32U);
    }
    if(!binary_fuse16_populate(big_set, (uint32_t)size, &filter)) {
      failure++;
    }
  }
  printf("failures %zu out of %zu\n\n", failure, total_trials);
  binary_fuse16_free(&filter);
  free(big_set);
}